

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O1

size_t tcache_salloc(tsdn_t *tsdn,void *ptr)

{
  rtree_ctx_cache_elm_t *prVar1;
  void *pvVar2;
  rtree_leaf_elm_t *prVar3;
  void *pvVar4;
  ulong uVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  rtree_ctx_cache_elm_t *prVar8;
  rtree_ctx_cache_elm_t *prVar9;
  rtree_ctx_t *rtree_ctx;
  bool bVar10;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_198;
  
  rtree_ctx = &rStack_198;
  if (tsdn == (tsdn_t *)0x0) {
    rtree_ctx_data_init(&rStack_198);
  }
  else {
    rtree_ctx = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  pvVar4 = (void *)((ulong)ptr & 0xffffffffc0000000);
  uVar5 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  prVar6 = (rtree_leaf_elm_t *)((long)&rtree_ctx->cache[0].leafkey + uVar5);
  pvVar2 = *(void **)((long)&rtree_ctx->cache[0].leafkey + uVar5);
  if (pvVar2 == pvVar4) {
    prVar6 = (rtree_leaf_elm_t *)
             ((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + (long)prVar6[1].le_bits.repr);
  }
  else if ((void *)rtree_ctx->l2_cache[0].leafkey == pvVar4) {
    prVar3 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = (uintptr_t)pvVar2;
    rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)prVar6[1].le_bits.repr;
    (prVar6->le_bits).repr = pvVar4;
    prVar6[1].le_bits.repr = prVar3;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar3->le_bits).repr + (ulong)((uint)ptr >> 9 & 0x1ffff8));
  }
  else {
    prVar8 = rtree_ctx->l2_cache + 1;
    if ((void *)rtree_ctx->l2_cache[1].leafkey == pvVar4) {
      uVar7 = 0;
      bVar10 = false;
    }
    else {
      uVar5 = 1;
      prVar9 = prVar8;
      do {
        uVar7 = uVar5;
        bVar10 = 6 < uVar7;
        if (uVar7 == 7) goto LAB_0014a7d3;
        prVar8 = prVar9 + 1;
        prVar1 = prVar9 + 1;
        uVar5 = uVar7 + 1;
        prVar9 = prVar8;
      } while ((void *)prVar1->leafkey != pvVar4);
      bVar10 = 6 < uVar7;
    }
    prVar3 = prVar8->leaf;
    prVar8->leafkey = rtree_ctx->l2_cache[uVar7].leafkey;
    prVar8->leaf = rtree_ctx->l2_cache[uVar7].leaf;
    rtree_ctx->l2_cache[uVar7].leafkey = (uintptr_t)pvVar2;
    rtree_ctx->l2_cache[uVar7].leaf = (rtree_leaf_elm_t *)prVar6[1].le_bits.repr;
    (prVar6->le_bits).repr = pvVar4;
    prVar6[1].le_bits.repr = prVar3;
    prVar6 = (rtree_leaf_elm_t *)
             ((long)&(prVar3->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
LAB_0014a7d3:
    if (bVar10) {
      prVar6 = rtree_leaf_elm_lookup_hard(tsdn,&extents_rtree,rtree_ctx,(uintptr_t)ptr,true,false);
    }
  }
  return sz_index2size_tab[(ulong)(prVar6->le_bits).repr >> 0x30];
}

Assistant:

size_t
tcache_salloc(tsdn_t *tsdn, const void *ptr) {
	return arena_salloc(tsdn, ptr);
}